

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O1

void __thiscall TPZCheckMesh::DependencyReport(TPZCheckMesh *this,int connect,TPZCompElSide *large)

{
  TPZCompElSide *pTVar1;
  TPZCompEl *pTVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  long *plVar6;
  ulong uVar7;
  TPZStack<TPZCompElSide,_10> equal;
  TPZStack<TPZCompElSide,_10> smalll;
  TPZStack<TPZCompElSide,_10> highdim;
  TPZCompElSide *local_278;
  undefined1 local_270 [40];
  undefined4 auStack_248 [36];
  undefined8 uStack_1b8;
  TPZStack<TPZCompElSide,_10> local_1b0;
  TPZStack<TPZCompElSide,_10> local_f0;
  
  lVar4 = 0x28;
  do {
    *(undefined8 *)((long)&uStack_1b8 + lVar4) = 0;
    *(undefined4 *)
     ((long)&(((TPZManVector<TPZCompElSide,_10> *)
              (local_1b0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
             super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar4) = 0xffffffff;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 200);
  local_1b0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
       local_1b0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
  local_1b0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements = 0;
  local_1b0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  local_1b0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01842198;
  local_278 = large;
  TPZCompElSide::HigherLevelElementList(large,&local_1b0,1,1);
  if (0 < (int)(uint)local_1b0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                     fNElements) {
    uVar7 = (ulong)((uint)local_1b0.super_TPZManVector<TPZCompElSide,_10>.
                          super_TPZVec<TPZCompElSide>.fNElements & 0x7fffffff);
    lVar4 = 8;
    do {
      plVar6 = *(long **)((long)local_1b0.super_TPZManVector<TPZCompElSide,_10>.
                                super_TPZVec<TPZCompElSide>.fStore + lVar4 + -8);
      iVar3 = (**(code **)(*plVar6 + 0xa0))
                        (plVar6,*(undefined4 *)
                                 ((long)&(local_1b0.super_TPZManVector<TPZCompElSide,_10>.
                                          super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar4));
      poVar5 = this->fOut;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Connect ",8);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," may depend on ",0xf);
      plVar6 = (long *)std::ostream::operator<<(poVar5,connect);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      lVar4 = lVar4 + 0x10;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  pTVar1 = local_278;
  TPZCompElSide::Reference((TPZGeoElSide *)local_270,local_278);
  iVar3 = TPZGeoElSide::Dimension((TPZGeoElSide *)local_270);
  if (iVar3 == 1) {
    lVar4 = 0x28;
    do {
      *(undefined8 *)((long)&local_278 + lVar4) = 0;
      *(undefined4 *)(local_270 + lVar4) = 0xffffffff;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 200);
    local_270._8_8_ = local_270 + 0x20;
    local_270._16_8_ = 0;
    local_270._24_8_ = 0;
    local_270._0_8_ = &PTR__TPZManVector_01842198;
    TPZCompElSide::EqualLevelElementList(pTVar1,(TPZStack<TPZCompElSide,_10> *)local_270,1,0);
    pTVar2 = pTVar1->fEl;
    iVar3 = pTVar1->fSide;
    (**(_func_int **)(local_270._0_8_ + 0x18))(local_270,local_270._16_8_ + 1);
    *(TPZCompEl **)(local_270._8_8_ + local_270._16_8_ * 0x10 + -0x10) = pTVar2;
    *(int *)(local_270._8_8_ + local_270._16_8_ * 0x10 + -8) = iVar3;
    lVar4 = 0x28;
    do {
      *(undefined8 *)
       ((long)local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + lVar4 + -0x28) = 0;
      *(undefined4 *)
       ((long)&(((TPZManVector<TPZCompElSide,_10> *)
                (local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
               super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar4) = 0xffffffff;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 200);
    pTVar1 = local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
    local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements = 0;
    local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
    local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
         (_func_int **)&PTR__TPZManVector_01842198;
    local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore = pTVar1;
    if (0 < (int)(uint)local_270._16_8_) {
      uVar7 = (ulong)((uint)local_270._16_8_ & 0x7fffffff);
      lVar4 = 0;
      do {
        TPZCompElSide::HigherDimensionElementList
                  ((TPZCompElSide *)((undefined1 *)local_270._8_8_ + lVar4),&local_f0,1,0);
        lVar4 = lVar4 + 0x10;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    TPZCompElSide::HigherDimensionElementList(local_278,&local_f0,1,0);
    if (0 < (int)(uint)local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                       fNElements) {
      uVar7 = (ulong)((uint)local_f0.super_TPZManVector<TPZCompElSide,_10>.
                            super_TPZVec<TPZCompElSide>.fNElements & 0x7fffffff);
      lVar4 = 0;
      do {
        DependencyReport(this,connect,
                         (TPZCompElSide *)
                         ((long)&(local_f0.super_TPZManVector<TPZCompElSide,_10>.
                                  super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar4));
        lVar4 = lVar4 + 0x10;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore == pTVar1)
    {
      local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
           (TPZCompElSide *)0x0;
    }
    local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
    local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
         (_func_int **)&PTR__TPZVec_0183b970;
    if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
        (TPZCompElSide *)0x0) {
      operator_delete__(local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                        fStore);
    }
    if ((TPZGeoEl *)local_270._8_8_ == (TPZGeoEl *)(local_270 + 0x20)) {
      local_270._8_8_ = (TPZGeoEl *)0x0;
    }
    local_270._24_8_ = 0;
    local_270._0_8_ = &PTR__TPZVec_0183b970;
    if ((TPZGeoEl *)local_270._8_8_ != (TPZGeoEl *)0x0) {
      operator_delete__((void *)local_270._8_8_);
    }
  }
  if (local_1b0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore ==
      local_1b0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
    local_1b0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
         (TPZCompElSide *)0x0;
  }
  local_1b0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  local_1b0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_0183b970;
  if (local_1b0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
      (TPZCompElSide *)0x0) {
    operator_delete__(local_1b0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                      fStore);
  }
  return;
}

Assistant:

void TPZCheckMesh::DependencyReport(int connect, TPZCompElSide & large) {
	
	TPZStack<TPZCompElSide> smalll;
	large.HigherLevelElementList(smalll,1,1);
	int nsmall = smalll.NElements();
	int is;
	for(is=0; is<nsmall; is++) {
		int conind = smalll[is].Element()->ConnectIndex(smalll[is].Side());
		(*fOut) << "Connect " << conind << " may depend on " << connect << endl;
	}
	if(large.Reference().Dimension() == 1) {
		TPZStack<TPZCompElSide> equal;
		large.EqualLevelElementList(equal,1,0);
		equal.Push(large);
		TPZStack<TPZCompElSide> highdim;
		int neq = equal.NElements();
		int eq;
		for(eq=0; eq<neq; eq++) equal[eq].HigherDimensionElementList(highdim,1,0);
		large.HigherDimensionElementList(highdim,1,0);
		int nhigh = highdim.NElements();
		int ih;
		for(ih=0; ih<nhigh; ih++) {
			DependencyReport(connect,highdim[ih]);
		}
	}
}